

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O3

SAXParseException * __thiscall
xercesc_4_0::SAXParseException::operator=(SAXParseException *this,SAXParseException *toAssign)

{
  short *psVar1;
  XMLCh *pXVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  XMLFileLoc XVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryManager *pMVar8;
  size_t sVar9;
  XMLCh *pXVar7;
  
  if (this != toAssign) {
    pMVar8 = (this->super_SAXException).fMemoryManager;
    (*pMVar8->_vptr_MemoryManager[4])(pMVar8,this->fPublicId);
    pMVar8 = (this->super_SAXException).fMemoryManager;
    (*pMVar8->_vptr_MemoryManager[4])(pMVar8,this->fSystemId);
    SAXException::operator=(&this->super_SAXException,&toAssign->super_SAXException);
    uVar3 = *(undefined4 *)((long)&toAssign->fColumnNumber + 4);
    XVar5 = toAssign->fLineNumber;
    uVar4 = *(undefined4 *)((long)&toAssign->fLineNumber + 4);
    *(int *)&this->fColumnNumber = (int)toAssign->fColumnNumber;
    *(undefined4 *)((long)&this->fColumnNumber + 4) = uVar3;
    *(int *)&this->fLineNumber = (int)XVar5;
    *(undefined4 *)((long)&this->fLineNumber + 4) = uVar4;
    pXVar2 = toAssign->fPublicId;
    pMVar8 = (this->super_SAXException).fMemoryManager;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar7 = (XMLCh *)0x0;
    }
    else {
      sVar9 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar9);
        sVar9 = sVar9 + 2;
      } while (*psVar1 != 0);
      iVar6 = (*pMVar8->_vptr_MemoryManager[3])(pMVar8,sVar9);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var,iVar6);
      memcpy(pXVar7,pXVar2,sVar9);
      pMVar8 = (this->super_SAXException).fMemoryManager;
    }
    this->fPublicId = pXVar7;
    pXVar2 = toAssign->fSystemId;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar7 = (XMLCh *)0x0;
    }
    else {
      sVar9 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar9);
        sVar9 = sVar9 + 2;
      } while (*psVar1 != 0);
      iVar6 = (*pMVar8->_vptr_MemoryManager[3])(pMVar8,sVar9);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
      memcpy(pXVar7,pXVar2,sVar9);
    }
    this->fSystemId = pXVar7;
  }
  return this;
}

Assistant:

SAXParseException&
SAXParseException::operator=(const SAXParseException& toAssign)
{
    if (this == &toAssign)
        return *this;

    fMemoryManager->deallocate(fPublicId);//XMLString::release(&fPublicId);
    fMemoryManager->deallocate(fSystemId);//XMLString::release(&fSystemId);

    this->SAXException::operator =(toAssign);
    fColumnNumber = toAssign.fColumnNumber;
    fLineNumber = toAssign.fLineNumber;

    fPublicId = XMLString::replicate(toAssign.fPublicId, fMemoryManager);
    fSystemId = XMLString::replicate(toAssign.fSystemId, fMemoryManager);

    return *this;
}